

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * lest::with_message(text *__return_storage_ptr__,text *message)

{
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"with message \"",message);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_58,local_58 + local_50);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text with_message( text message )
{
    return "with message \"" + message + "\"";
}